

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O0

void Pf_StoCreateGate(Pf_Man_t *pMan,Mio_Cell_t *pCell,int **pComp,int **pPerm,int *pnPerms)

{
  int iVar1;
  undefined4 uVar2;
  word wVar3;
  word wVar4;
  int iVar5;
  int iVar6;
  int local_84;
  int t;
  int c;
  int p;
  int i;
  word tTemp2;
  word tTemp1;
  word tCur;
  int nMints;
  int nPerms;
  int *Perm2;
  int *Perm1;
  int Perm [6];
  int *pnPerms_local;
  int **pPerm_local;
  int **pComp_local;
  Mio_Cell_t *pCell_local;
  Pf_Man_t *pMan_local;
  
  iVar1 = pnPerms[*(uint *)&pCell->field_0x8 >> 0x1c];
  uVar2 = *(undefined4 *)&pCell->field_0x8;
  Perm._16_8_ = pnPerms;
  for (c = 0; c < (int)(*(uint *)&pCell->field_0x8 >> 0x1c); c = c + 1) {
    iVar5 = Abc_Var2Lit(c,0);
    Perm[(long)c + -2] = iVar5;
  }
  wVar3 = pCell->uTruth;
  t = 0;
  tTemp1 = wVar3;
  while( true ) {
    wVar4 = tTemp1;
    if (iVar1 <= t) {
      if (wVar3 == tTemp1) {
        return;
      }
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                    ,0xca,"void Pf_StoCreateGate(Pf_Man_t *, Mio_Cell_t *, int **, int **, int *)");
    }
    for (local_84 = 0; local_84 < 1 << (byte)((uint)uVar2 >> 0x1c); local_84 = local_84 + 1) {
      Pf_StoCreateGateAdd(pMan,tTemp1,(int *)&Perm1,*(uint *)&pCell->field_0x8 >> 0x1c,
                          *(uint *)&pCell->field_0x8 & 0xfffffff);
      tTemp1 = Abc_Tt6Flip(tTemp1,pComp[*(uint *)&pCell->field_0x8 >> 0x1c][local_84]);
      iVar5 = pComp[*(uint *)&pCell->field_0x8 >> 0x1c][local_84];
      iVar6 = Abc_LitNot(Perm[(long)iVar5 + -2]);
      Perm[(long)iVar5 + -2] = iVar6;
    }
    if (wVar4 != tTemp1) break;
    tTemp1 = Abc_Tt6SwapAdjacent(tTemp1,pPerm[*(uint *)&pCell->field_0x8 >> 0x1c][t]);
    iVar5 = pPerm[*(uint *)&pCell->field_0x8 >> 0x1c][t];
    iVar6 = Perm[(long)iVar5 + -2];
    Perm[(long)iVar5 + -2] = Perm[(long)iVar5 + -1];
    Perm[(long)iVar5 + -1] = iVar6;
    t = t + 1;
  }
  __assert_fail("tTemp2 == tCur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                ,0xc3,"void Pf_StoCreateGate(Pf_Man_t *, Mio_Cell_t *, int **, int **, int *)");
}

Assistant:

void Pf_StoCreateGate( Pf_Man_t * pMan, Mio_Cell_t * pCell, int ** pComp, int ** pPerm, int * pnPerms )
{
    int Perm[PF_LEAF_MAX], * Perm1, * Perm2;
    int nPerms = pnPerms[pCell->nFanins];
    int nMints = (1 << pCell->nFanins);
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    for ( i = 0; i < (int)pCell->nFanins; i++ )
        Perm[i] = Abc_Var2Lit( i, 0 );
    tCur = tTemp1 = pCell->uTruth;
    for ( p = 0; p < nPerms; p++ )
    {
        tTemp2 = tCur;
        for ( c = 0; c < nMints; c++ )
        {
            Pf_StoCreateGateAdd( pMan, tCur, Perm, pCell->nFanins, pCell->Id );
            // update
            tCur  = Abc_Tt6Flip( tCur, pComp[pCell->nFanins][c] );
            Perm1 = Perm + pComp[pCell->nFanins][c];
            *Perm1 = Abc_LitNot( *Perm1 );
        }
        assert( tTemp2 == tCur );
        // update
        tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[pCell->nFanins][p] );
        Perm1 = Perm + pPerm[pCell->nFanins][p];
        Perm2 = Perm1 + 1;
        ABC_SWAP( int, *Perm1, *Perm2 );
    }
    assert( tTemp1 == tCur );
}